

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumePattern
          (ParsedPatternInfo *this,UnicodeString *patternString,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  UErrorCode *status_local;
  UnicodeString *patternString_local;
  ParsedPatternInfo *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UnicodeString::operator=(&this->pattern,patternString);
    this->currentSubpattern = &this->positive;
    consumeSubpattern(this,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      UVar2 = ParserState::peek(&this->state);
      if (UVar2 == 0x3b) {
        ParserState::next(&this->state);
        UVar2 = ParserState::peek(&this->state);
        if (UVar2 != -1) {
          this->fHasNegativeSubpattern = true;
          this->currentSubpattern = &this->negative;
          consumeSubpattern(this,status);
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 != '\0') {
            return;
          }
        }
      }
      UVar2 = ParserState::peek(&this->state);
      if (UVar2 != -1) {
        ParserState::toParseException(&this->state,L"Found unquoted special character");
        *status = U_UNQUOTED_SPECIAL;
      }
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumePattern(const UnicodeString& patternString, UErrorCode& status) {
    if (U_FAILURE(status)) { return; }
    this->pattern = patternString;

    // This class is not intended for writing twice!
    // Use move assignment to overwrite instead.
    U_ASSERT(state.offset == 0);

    // pattern := subpattern (';' subpattern)?
    currentSubpattern = &positive;
    consumeSubpattern(status);
    if (U_FAILURE(status)) { return; }
    if (state.peek() == u';') {
        state.next(); // consume the ';'
        // Don't consume the negative subpattern if it is empty (trailing ';')
        if (state.peek() != -1) {
            fHasNegativeSubpattern = true;
            currentSubpattern = &negative;
            consumeSubpattern(status);
            if (U_FAILURE(status)) { return; }
        }
    }
    if (state.peek() != -1) {
        state.toParseException(u"Found unquoted special character");
        status = U_UNQUOTED_SPECIAL;
    }
}